

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O1

void __thiscall cmCTestMultiProcessHandler::ReadCostData(cmCTestMultiProcessHandler *this)

{
  pointer pcVar1;
  char cVar2;
  pointer pSVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  istream *piVar7;
  mapped_type *ppcVar8;
  int index;
  string line;
  string name;
  vector<cmsys::String,_std::allocator<cmsys::String>_> parts;
  string fname;
  ifstream fin;
  int local_2c4;
  PropertiesMap *local_2c0;
  string local_2b8;
  double local_298;
  string local_290;
  vector<cmsys::String,_std::allocator<cmsys::String>_> local_270;
  string local_258;
  long local_238 [65];
  
  cmCTest::GetCostDataFile_abi_cxx11_(&local_258,this->CTest);
  bVar4 = cmsys::SystemTools::FileExists(local_258._M_dataplus._M_p,true);
  if (!bVar4) {
LAB_0031be3a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    return;
  }
  std::ifstream::ifstream(local_238);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)local_258._M_dataplus._M_p);
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_2b8._M_string_length = 0;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_2c0 = &this->Properties;
  while( true ) {
    cVar2 = (char)(istream *)local_238;
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2b8,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    iVar6 = std::__cxx11::string::compare((char *)&local_2b8);
    if (iVar6 == 0) break;
    cmsys::SystemTools::SplitString(&local_270,&local_2b8,' ',false);
    if ((ulong)((long)local_270.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)local_270.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                     _M_impl.super__Vector_impl_data._M_start) < 0x41) {
      bVar4 = true;
      std::ifstream::close();
    }
    else {
      pcVar1 = ((local_270.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl
                 .super__Vector_impl_data._M_start)->super_string)._M_dataplus._M_p;
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_290,pcVar1,
                 pcVar1 + ((local_270.
                            super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                            _M_impl.super__Vector_impl_data._M_start)->super_string).
                          _M_string_length);
      pSVar3 = local_270.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar6 = atoi(local_270.super__Vector_base<cmsys::String,_std::allocator<cmsys::String>_>.
                   _M_impl.super__Vector_impl_data._M_start[1].super_string._M_dataplus._M_p);
      local_298 = atof(pSVar3[2].super_string._M_dataplus._M_p);
      local_2c4 = SearchByName(this,&local_290);
      if (local_2c4 != -1) {
        ppcVar8 = std::
                  map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                  ::operator[](&local_2c0->
                                super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                               ,&local_2c4);
        (*ppcVar8)->PreviousRuns = iVar6;
        if ((1 < this->ParallelLevel) &&
           (ppcVar8 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_2c0->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&local_2c4), *ppcVar8 != (mapped_type)0x0)) {
          ppcVar8 = std::
                    map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                    ::operator[](&local_2c0->
                                  super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                 ,&local_2c4);
          if (((*ppcVar8)->Cost == 0.0) && (!NAN((*ppcVar8)->Cost))) {
            ppcVar8 = std::
                      map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                      ::operator[](&local_2c0->
                                    super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                                   ,&local_2c4);
            (*ppcVar8)->Cost = (float)local_298;
          }
        }
      }
      bVar4 = false;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
    }
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::~vector(&local_270);
    if (bVar4) goto LAB_0031be11;
  }
  while( true ) {
    cVar5 = std::ios::widen((char)*(undefined8 *)(local_238[0] + -0x18) + cVar2);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238,(string *)&local_2b8,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) break;
    iVar6 = std::__cxx11::string::compare((char *)&local_2b8);
    if (iVar6 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->LastTestsFailed,&local_2b8);
    }
  }
  std::ifstream::close();
LAB_0031be11:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  std::ifstream::~ifstream(local_238);
  goto LAB_0031be3a;
}

Assistant:

void cmCTestMultiProcessHandler::ReadCostData()
{
  std::string fname = this->CTest->GetCostDataFile();

  if (cmSystemTools::FileExists(fname.c_str(), true)) {
    cmsys::ifstream fin;
    fin.open(fname.c_str());
    std::string line;
    while (std::getline(fin, line)) {
      if (line == "---") {
        break;
      }

      std::vector<cmsys::String> parts = cmSystemTools::SplitString(line, ' ');

      // Probably an older version of the file, will be fixed next run
      if (parts.size() < 3) {
        fin.close();
        return;
      }

      std::string name = parts[0];
      int prev = atoi(parts[1].c_str());
      float cost = static_cast<float>(atof(parts[2].c_str()));

      int index = this->SearchByName(name);
      if (index == -1) {
        continue;
      }

      this->Properties[index]->PreviousRuns = prev;
      // When not running in parallel mode, don't use cost data
      if (this->ParallelLevel > 1 && this->Properties[index] &&
          this->Properties[index]->Cost == 0) {
        this->Properties[index]->Cost = cost;
      }
    }
    // Next part of the file is the failed tests
    while (std::getline(fin, line)) {
      if (line != "") {
        this->LastTestsFailed.push_back(line);
      }
    }
    fin.close();
  }
}